

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::ImmediatePromiseNode<unsigned_long>::ImmediatePromiseNode
          (ImmediatePromiseNode<unsigned_long> *this,ExceptionOr<unsigned_long> *result)

{
  bool bVar1;
  
  ImmediatePromiseNodeBase::ImmediatePromiseNodeBase(&this->super_ImmediatePromiseNodeBase);
  (this->super_ImmediatePromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_007062e8;
  Maybe<kj::Exception>::Maybe((Maybe<kj::Exception> *)&this->result,(Maybe<kj::Exception> *)result);
  bVar1 = (result->value).ptr.isSet;
  (this->result).value.ptr.isSet = bVar1;
  if (bVar1 == true) {
    (this->result).value.ptr.field_1 = (result->value).ptr.field_1;
  }
  if ((result->value).ptr.isSet == true) {
    (result->value).ptr.isSet = false;
  }
  return;
}

Assistant:

ImmediatePromiseNode(ExceptionOr<T>&& result): result(kj::mv(result)) {}